

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ColladaLoader.cpp
# Opt level: O0

string * __thiscall
Assimp::ColladaLoader::FindNameForNode_abi_cxx11_
          (string *__return_storage_ptr__,ColladaLoader *this,Node *pNode)

{
  ulong uVar1;
  basic_formatter<char,std::char_traits<char>,std::allocator<char>> *pbVar2;
  basic_formatter *pbVar3;
  uint local_324;
  basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> local_320;
  uint local_1a8 [4];
  basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> local_198;
  Node *local_20;
  Node *pNode_local;
  ColladaLoader *this_local;
  
  local_20 = pNode;
  pNode_local = (Node *)this;
  this_local = (ColladaLoader *)__return_storage_ptr__;
  if ((this->useColladaName & 1U) == 0) {
    uVar1 = std::__cxx11::string::empty();
    if ((uVar1 & 1) == 0) {
      std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)&local_20->mID);
    }
    else {
      uVar1 = std::__cxx11::string::empty();
      if ((uVar1 & 1) == 0) {
        std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)&local_20->mSID);
      }
      else {
        Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
        basic_formatter(&local_320);
        pbVar2 = (basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
                 Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
                 operator<<((basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
                            &local_320,(char (*) [19])"$ColladaAutoName$_");
        local_324 = this->mNodeNameCounter;
        this->mNodeNameCounter = local_324 + 1;
        pbVar3 = (basic_formatter *)
                 Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
                 operator<<(pbVar2,&local_324);
        Formatter::basic_formatter::operator_cast_to_string(__return_storage_ptr__,pbVar3);
        Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
        ~basic_formatter(&local_320);
      }
    }
  }
  else {
    uVar1 = std::__cxx11::string::empty();
    if ((uVar1 & 1) == 0) {
      std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)local_20);
    }
    else {
      Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
      basic_formatter(&local_198);
      pbVar2 = (basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
               Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
               operator<<((basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
                          &local_198,(char (*) [19])"$ColladaAutoName$_");
      local_1a8[0] = this->mNodeNameCounter;
      this->mNodeNameCounter = local_1a8[0] + 1;
      pbVar3 = (basic_formatter *)
               Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
               operator<<(pbVar2,local_1a8);
      Formatter::basic_formatter::operator_cast_to_string(__return_storage_ptr__,pbVar3);
      Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
      ~basic_formatter(&local_198);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string ColladaLoader::FindNameForNode(const Collada::Node* pNode)
{
    // If explicitly requested, just use the collada name.
    if (useColladaName)
    {
        if (!pNode->mName.empty()) {
            return pNode->mName;
        }
        else {
            return format() << "$ColladaAutoName$_" << mNodeNameCounter++;
        }
    }
    else
    {
        // Now setup the name of the assimp node. The collada name might not be
        // unique, so we use the collada ID.
        if (!pNode->mID.empty())
            return pNode->mID;
        else if (!pNode->mSID.empty())
            return pNode->mSID;
        else
        {
            // No need to worry. Unnamed nodes are no problem at all, except
            // if cameras or lights need to be assigned to them.
            return format() << "$ColladaAutoName$_" << mNodeNameCounter++;
        }
    }
}